

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::Image::InvalidCreateImage::iterate(InvalidCreateImage *this)

{
  InvalidCreateImage *this_local;
  
  checkCreate(this,"Testing bad display (-1)...",&DAT_ffffffffffffffff,"(EGLDisplay)-1",
              (EGLContext)0x0,"EGL_NO_CONTEXT",0x3038,"EGL_NONE",0x3008);
  checkCreate(this,"Testing bad context (-1)...",(this->super_ImageTestCase).m_display,"m_display",
              &DAT_ffffffffffffffff,"(EGLContext)-1",0x3038,"EGL_NONE",0x3006);
  checkCreate(this,"Testing bad source (-1)...",(this->super_ImageTestCase).m_display,"m_display",
              (EGLContext)0x0,"EGL_NO_CONTEXT",0xffffffff,"(EGLenum)-1",0x300c);
  tcu::TestContext::setTestResult
            ((this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
#define CHECK_CREATE(MSG, DPY, CONTEXT, SOURCE, ERR) checkCreate(MSG, DPY, #DPY, CONTEXT, #CONTEXT, SOURCE, #SOURCE, ERR)
		CHECK_CREATE("Testing bad display (-1)...", (EGLDisplay)-1, EGL_NO_CONTEXT, EGL_NONE, EGL_BAD_DISPLAY);
		CHECK_CREATE("Testing bad context (-1)...", m_display, (EGLContext)-1, EGL_NONE, EGL_BAD_CONTEXT);
		CHECK_CREATE("Testing bad source (-1)...", m_display, EGL_NO_CONTEXT, (EGLenum)-1, EGL_BAD_PARAMETER);
#undef CHECK_CREATE

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}